

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

array_container_t * array_container_clone(array_container_t *src)

{
  array_container_t *newcontainer;
  array_container_t *src_local;
  
  src_local = array_container_create_given_capacity(src->capacity);
  if (src_local == (array_container_t *)0x0) {
    src_local = (array_container_t *)0x0;
  }
  else {
    src_local->cardinality = src->cardinality;
    memcpy(src_local->array,src->array,(long)src->cardinality << 1);
  }
  return src_local;
}

Assistant:

array_container_t *array_container_clone(const array_container_t *src) {
    array_container_t *newcontainer =
        array_container_create_given_capacity(src->capacity);
    if (newcontainer == NULL) return NULL;

    newcontainer->cardinality = src->cardinality;

    memcpy(newcontainer->array, src->array,
           src->cardinality * sizeof(uint16_t));

    return newcontainer;
}